

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_SetTargetRGB(GPU_Target *target,Uint8 r,Uint8 g,Uint8 b)

{
  bool local_18;
  SDL_Color local_17;
  SDL_Color c;
  Uint8 b_local;
  Uint8 g_local;
  Uint8 r_local;
  GPU_Target *target_local;
  
  local_17.g = g;
  local_17.r = r;
  local_17.b = b;
  local_17.a = 0xff;
  if (target != (GPU_Target *)0x0) {
    local_18 = false;
    if ((r == 0xff) && (local_18 = false, g == 0xff)) {
      local_18 = b == 0xff;
    }
    target->use_color = (_Bool)((local_18 ^ 0xffU) & 1);
    target->color = local_17;
  }
  return;
}

Assistant:

void GPU_SetTargetRGB(GPU_Target* target, Uint8 r, Uint8 g, Uint8 b)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = 255;

    if(target == NULL)
        return;

    target->use_color = !(r == 255 && g == 255 && b == 255);
    target->color = c;
}